

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

int __thiscall FWeaponSlots::RestoreSlots(FWeaponSlots *this,FConfigFile *config,char *section)

{
  bool bVar1;
  int iVar2;
  char *name;
  int local_44;
  char *pcStack_40;
  int slotsread;
  char *value;
  char *key;
  FString section_name;
  char *section_local;
  FConfigFile *config_local;
  FWeaponSlots *this_local;
  
  section_name.Chars = section;
  FString::FString((FString *)&key,section);
  local_44 = 0;
  FString::operator+=((FString *)&key,".Weapons");
  name = FString::operator_cast_to_char_((FString *)&key);
  bVar1 = FConfigFile::SetSection(config,name,false);
  if (bVar1) {
    while (bVar1 = FConfigFile::NextInSection(config,&value,&stack0xffffffffffffffc0), bVar1) {
      iVar2 = strncasecmp(value,"Slot[",5);
      if ((((iVar2 == 0) && ('/' < value[5])) && (value[5] < ';')) &&
         ((value[6] == ']' && (value[7] == '\0')))) {
        FWeaponSlot::AddWeaponList
                  ((FWeaponSlot *)((long)value[5] * 0x10 + -0x300 + (long)this),pcStack_40,true);
        local_44 = local_44 + 1;
      }
    }
    this_local._4_4_ = local_44;
  }
  else {
    this_local._4_4_ = 0;
  }
  FString::~FString((FString *)&key);
  return this_local._4_4_;
}

Assistant:

int FWeaponSlots::RestoreSlots(FConfigFile *config, const char *section)
{
	FString section_name(section);
	const char *key, *value;
	int slotsread = 0;

	section_name += ".Weapons";
	if (!config->SetSection(section_name))
	{
		return 0;
	}
	while (config->NextInSection (key, value))
	{
		if (strnicmp (key, "Slot[", 5) != 0 ||
			key[5] < '0' ||
			key[5] > '0'+NUM_WEAPON_SLOTS ||
			key[6] != ']' ||
			key[7] != 0)
		{
			continue;
		}
		Slots[key[5] - '0'].AddWeaponList(value, true);
		slotsread++;
	}
	return slotsread;
}